

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatbuffer_builder.h
# Opt level: O1

Offset<flatbuffers::Vector<flatbuffers::Offset<reflection::KeyValue>,_unsigned_int>_> __thiscall
flatbuffers::FlatBufferBuilderImpl<false>::CreateVector<reflection::KeyValue>
          (FlatBufferBuilderImpl<false> *this,Offset<reflection::KeyValue> *v,size_t len)

{
  uoffset_t element;
  Offset<flatbuffers::Vector<flatbuffers::Offset<reflection::KeyValue>,_unsigned_int>_> OVar1;
  size_t sVar2;
  size_t sVar3;
  
  StartVector<flatbuffers::Offset,unsigned_int>(this,len,4,4);
  sVar2 = len;
  if (len != 0) {
    do {
      sVar3 = sVar2 - 1;
      element = ReferTo(this,v[sVar2 - 1].o);
      PushElement<unsigned_int,unsigned_int>(this,element);
      sVar2 = sVar3;
    } while (sVar3 != 0);
  }
  OVar1.o = EndVector<unsigned_int,unsigned_int>(this,len);
  return (Offset<flatbuffers::Vector<flatbuffers::Offset<reflection::KeyValue>,_unsigned_int>_>)
         OVar1.o;
}

Assistant:

Offset<Vector<Offset<T>>> CreateVector(const Offset<T> *v, size_t len) {
    StartVector<Offset<T>>(len);
    for (auto i = len; i > 0;) { PushElement(v[--i]); }
    return Offset<Vector<Offset<T>>>(EndVector(len));
  }